

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestResults.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_26dba::TestNotifiesReporterOfTestStartWithCorrectInfo::
~TestNotifiesReporterOfTestStartWithCorrectInfo
          (TestNotifiesReporterOfTestStartWithCorrectInfo *this)

{
  TestNotifiesReporterOfTestStartWithCorrectInfo *this_local;
  
  ~TestNotifiesReporterOfTestStartWithCorrectInfo(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(NotifiesReporterOfTestStartWithCorrectInfo)
{
    RecordingReporter reporter;
    TestResults results(&reporter);
    results.OnTestStart(details);

    CHECK_EQUAL (1, reporter.testRunCount);
    CHECK_EQUAL ("suitename", reporter.lastStartedSuite);
    CHECK_EQUAL ("testname", reporter.lastStartedTest);
}